

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O1

BoundCaseCheck __thiscall
duckdb::BoundCaseCheck::Deserialize(BoundCaseCheck *this,Deserializer *deserializer)

{
  int iVar1;
  Expression *in_RAX;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> extraout_RDX;
  byte bVar2;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var3;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var4;
  BoundCaseCheck BVar5;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_28;
  
  (this->when_expr).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
  _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false> =
       (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0;
  (this->then_expr).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
  _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  local_28._M_head_impl = in_RAX;
  iVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,100,"when_expr");
  bVar2 = (byte)iVar1;
  if (bVar2 == 0) {
    _Var3._M_head_impl =
         (this->when_expr).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (this->when_expr).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
    ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false> =
         (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0;
    if (_Var3._M_head_impl != (Expression *)0x0) goto LAB_010b3ef6;
    bVar2 = 0;
  }
  else {
    iVar1 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar1 == '\0') {
      _Var4._M_head_impl = (Expression *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      Expression::Deserialize((Expression *)&stack0xffffffffffffffd8,deserializer);
      _Var4._M_head_impl = local_28._M_head_impl;
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var3._M_head_impl =
         (this->when_expr).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (this->when_expr).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
    ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false> =
         (_Head_base<0UL,_duckdb::Expression_*,_false>)_Var4._M_head_impl;
    if (_Var3._M_head_impl == (Expression *)0x0) {
      bVar2 = 1;
    }
    else {
LAB_010b3ef6:
      (*((_Var3._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)bVar2);
  iVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x65,"then_expr");
  bVar2 = (byte)iVar1;
  if (bVar2 == 0) {
    _Var3._M_head_impl =
         (this->then_expr).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (this->then_expr).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
    ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    if (_Var3._M_head_impl == (Expression *)0x0) {
      bVar2 = 0;
      goto LAB_010b3f98;
    }
  }
  else {
    iVar1 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar1 == '\0') {
      local_28._M_head_impl = (Expression *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      Expression::Deserialize((Expression *)&stack0xffffffffffffffd8,deserializer);
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var3._M_head_impl =
         (this->then_expr).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (this->then_expr).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
    ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = local_28._M_head_impl;
    if (_Var3._M_head_impl == (Expression *)0x0) {
      bVar2 = 1;
      goto LAB_010b3f98;
    }
  }
  (*((_Var3._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
LAB_010b3f98:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)bVar2);
  BVar5.then_expr.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
  _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
       extraout_RDX.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
       _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  BVar5.when_expr.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
  _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
  return BVar5;
}

Assistant:

BoundCaseCheck BoundCaseCheck::Deserialize(Deserializer &deserializer) {
	BoundCaseCheck result;
	deserializer.ReadPropertyWithDefault<unique_ptr<Expression>>(100, "when_expr", result.when_expr);
	deserializer.ReadPropertyWithDefault<unique_ptr<Expression>>(101, "then_expr", result.then_expr);
	return result;
}